

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_bind(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  undefined1 local_34 [8];
  sockaddr_in6 sin;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  sin._20_8_ = address;
  memset(local_34,0,0x1c);
  local_34._0_2_ = 10;
  if (sin._20_8_ == 0) {
    local_34._2_2_ = 0;
    sin.sin6_family = _in6addr_any;
    sin.sin6_port = in6addr_any_2;
    sin.sin6_flowinfo = uRam0000000000110034;
    sin.sin6_addr.__in6_u._0_8_ = _setsockopt;
  }
  else {
    local_34._2_2_ = htons(*(uint16_t *)(sin._20_8_ + 0x10));
    sin._0_8_ = *(undefined8 *)sin._20_8_;
    sin.sin6_addr.__in6_u._0_8_ = *(undefined8 *)(sin._20_8_ + 8);
  }
  iVar1 = bind(socket,(sockaddr *)local_34,0x1c);
  return iVar1;
}

Assistant:

int enet_socket_bind(ENetSocket socket, const ENetAddress* address) {
	struct sockaddr_in6 sin;

	memset(&sin, 0, sizeof(struct sockaddr_in6));

	sin.sin6_family = AF_INET6;

	if (address != NULL) {
		sin.sin6_port = ENET_HOST_TO_NET_16(address->port);
		sin.sin6_addr = address->ipv6;
	}
	else {
		sin.sin6_port = 0;
		sin.sin6_addr = ENET_HOST_ANY;
	}

	return bind(socket, (struct sockaddr*)&sin, sizeof(struct sockaddr_in6));
}